

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

void log_objmenu(int n,nh_objresult *pick_list)

{
  ulong uVar1;
  char *fmt;
  
  if ((logfile != -1) && (iflags.disable_log == '\0')) {
    if (n == -1) {
      fmt = " o:x";
    }
    else {
      lprintf(" o:[");
      fmt = "]";
      if (0 < n) {
        uVar1 = 0;
        do {
          if (pick_list[uVar1].count < 0) {
            lprintf("%x:",(ulong)(uint)pick_list[uVar1].id);
          }
          else {
            lprintf("%x,%x:",(ulong)(uint)pick_list[uVar1].id);
          }
          uVar1 = uVar1 + 1;
        } while ((uint)n != uVar1);
      }
    }
    lprintf(fmt);
    return;
  }
  return;
}

Assistant:

void log_objmenu(int n, struct nh_objresult *pick_list)
{
    int i;
    if (logfile == -1 || iflags.disable_log)
	return;
    
    if (n == -1) {
	lprintf(" o:x");
	return;
    }
    
    lprintf(" o:[");
    for (i = 0; i < n; i++) {
	if (pick_list[i].count > -1)
	    lprintf("%x,%x:", pick_list[i].id, pick_list[i].count);
	else
	    lprintf("%x:", pick_list[i].id);
    }
    
    lprintf("]");
}